

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8d_vdpu2.c
# Opt level: O3

MPP_RET hal_vp8d_vdpu2_start(void *hal,HalTaskInfo *task)

{
  undefined8 uVar1;
  MPP_RET MVar2;
  MPP_RET MVar3;
  FILE *pFVar4;
  void *pvVar5;
  size_t sVar6;
  char *fmt;
  VP8DHalContext_t *ctx;
  uint uVar7;
  ulong uVar8;
  MppDevRegRdCfg rd_cfg;
  char name [256];
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  
  uVar1 = *(undefined8 *)((long)hal + 0x18);
  if ((hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x286,
               "hal_vp8d_vdpu2_start");
  }
  if ((hal_vp8d_debug & 4) != 0) {
    hal_vp8d_vdpu2_dump_info_frame_cnt = hal_vp8d_vdpu2_dump_info_frame_cnt + 1;
    sprintf((char *)&local_138,"/data/video/reg_%d.bin");
    pFVar4 = fopen((char *)&local_138,"ab+");
    if (pFVar4 != (FILE *)0x0) {
      uVar8 = 0;
      do {
        fprintf(pFVar4,"reg[%d] %#08x\n",uVar8 & 0xffffffff);
        uVar8 = uVar8 + 1;
      } while (uVar8 != 0x9f);
      fclose(pFVar4);
    }
    sprintf((char *)&local_138,"/data/video/seg_map_%d.bin",
            (ulong)hal_vp8d_vdpu2_dump_info_frame_cnt);
    pFVar4 = fopen((char *)&local_138,"ab+");
    if (pFVar4 != (FILE *)0x0) {
      pvVar5 = mpp_buffer_get_ptr_with_caller
                         (*(MppBuffer *)((long)hal + 0x38),"hal_vp8d_vdpu2_dump_info");
      sVar6 = mpp_buffer_get_size_with_caller
                        (*(MppBuffer *)((long)hal + 0x38),"hal_vp8d_vdpu2_dump_info");
      if (3 < sVar6) {
        uVar7 = 1;
        uVar8 = 0;
        do {
          fprintf(pFVar4,"%#08x\n",(ulong)*(uint *)((long)pvVar5 + uVar8 * 4));
          uVar8 = (ulong)uVar7;
          sVar6 = mpp_buffer_get_size_with_caller
                            (*(MppBuffer *)((long)hal + 0x38),"hal_vp8d_vdpu2_dump_info");
          uVar7 = uVar7 + 1;
        } while (uVar8 < sVar6 >> 2);
      }
      fclose(pFVar4);
    }
    sprintf((char *)&local_138,"/data/video/probe_%d.bin",(ulong)hal_vp8d_vdpu2_dump_info_frame_cnt)
    ;
    pFVar4 = fopen((char *)&local_138,"ab+");
    if (pFVar4 != (FILE *)0x0) {
      pvVar5 = mpp_buffer_get_ptr_with_caller
                         (*(MppBuffer *)((long)hal + 0x30),"hal_vp8d_vdpu2_dump_info");
      sVar6 = mpp_buffer_get_size_with_caller
                        (*(MppBuffer *)((long)hal + 0x30),"hal_vp8d_vdpu2_dump_info");
      if (3 < sVar6) {
        uVar7 = 1;
        uVar8 = 0;
        do {
          fprintf(pFVar4,"%#08x\n",(ulong)*(uint *)((long)pvVar5 + uVar8 * 4));
          uVar8 = (ulong)uVar7;
          sVar6 = mpp_buffer_get_size_with_caller
                            (*(MppBuffer *)((long)hal + 0x30),"hal_vp8d_vdpu2_dump_info");
          uVar7 = uVar7 + 1;
        } while (uVar8 < sVar6 >> 2);
      }
      fclose(pFVar4);
    }
  }
  local_130 = 0x27c;
  local_138 = uVar1;
  MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),4,&local_138);
  if (MVar2 == MPP_OK) {
    local_140 = 0x27c;
    local_148 = uVar1;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),5,&local_148);
    if (MVar2 == MPP_OK) {
      MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),0xf,(void *)0x0);
      MVar2 = MPP_OK;
      if (MVar3 != MPP_OK) {
        _mpp_log_l(2,"hal_vp8d_vdpu2","send cmd failed %d\n","hal_vp8d_vdpu2_start",
                   (ulong)(uint)MVar3);
        MVar2 = MVar3;
      }
      goto LAB_001ffdcf;
    }
    fmt = "set register read failed %d\n";
  }
  else {
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_vp8d_vdpu2",fmt,"hal_vp8d_vdpu2_start",(ulong)(uint)MVar2);
LAB_001ffdcf:
  if ((hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x2aa,
               "hal_vp8d_vdpu2_start");
  }
  return MVar2;
}

Assistant:

MPP_RET hal_vp8d_vdpu2_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    VP8DHalContext_t *ctx = (VP8DHalContext_t *)hal;
    VP8DRegSet_t *regs = (VP8DRegSet_t *)ctx->regs;

    FUN_T("FUN_IN");
    if (hal_vp8d_debug & VP8H_DBG_DUMP_REG)
        hal_vp8d_vdpu2_dump_info(hal, task);

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 reg_size = sizeof(VP8DRegSet_t);

        wr_cfg.reg = regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = regs;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    FUN_T("FUN_OUT");

    (void)task;
    return ret;
}